

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_image *
rf_image_color_tint_to_buffer
          (rf_image *__return_storage_ptr__,rf_image image,rf_color color,void *dst,rf_int dst_size)

{
  rf_image image_00;
  rf_image rVar1;
  int iVar2;
  rf_color rVar3;
  int iVar4;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined1 local_64;
  undefined1 uStack_63;
  undefined1 uStack_62;
  undefined1 uStack_61;
  void *pvStack_60;
  rf_color pixel_rgba32;
  void *dst_pixel;
  void *src_pixel;
  int iStack_48;
  int index;
  rf_int x;
  rf_int y;
  float c_a;
  float c_b;
  float c_g;
  float c_r;
  int bpp;
  rf_int dst_size_local;
  void *dst_local;
  rf_color color_local;
  
  rVar1 = image;
  memset(__return_storage_ptr__,0,0x18);
  if (((undefined1  [24])image & (undefined1  [24])0x100000000) != (undefined1  [24])0x0) {
    image_00.format = in_stack_ffffffffffffff70;
    image_00._0_16_ = image._8_16_;
    image_00._20_4_ = in_stack_ffffffffffffff74;
    iVar2 = rf_image_size(image_00);
    if (iVar2 <= dst_size) {
      iVar2 = rf_bytes_per_pixel(image.format);
      x = 0;
      while( true ) {
        if (image.height <= x) break;
        for (_iStack_48 = 0; _iStack_48 < image.width; _iStack_48 = _iStack_48 + 1) {
          iVar4 = (int)x * image.width + iStack_48;
          pvStack_60 = (void *)((long)image.data + (long)(iVar4 * iVar2));
          rVar3 = rf_format_one_pixel_to_rgba32
                            ((void *)((long)image.data + (long)(iVar4 * iVar2)),image.format);
          _local_64 = CONCAT13((char)(int)(((float)((uint)rVar3 >> 0x18) / 255.0) *
                                           ((float)((uint)color >> 0x18) / 255.0) * 255.0),
                               CONCAT12((char)(int)(((float)((uint)rVar3 >> 0x10 & 0xff) / 255.0) *
                                                    ((float)((uint)color >> 0x10 & 0xff) / 255.0) *
                                                   255.0),
                                        CONCAT11((char)(int)(((float)((uint)rVar3 >> 8 & 0xff) /
                                                             255.0) * ((float)((uint)color >> 8 &
                                                                              0xff) / 255.0) * 255.0
                                                            ),
                                                 (char)(int)(((float)((uint)rVar3 & 0xff) / 255.0) *
                                                             ((float)((uint)color & 0xff) / 255.0) *
                                                            255.0))));
          rf_format_one_pixel(&local_64,RF_UNCOMPRESSED_R8G8B8A8,pvStack_60,image.format);
        }
        x = x + 1;
      }
      __return_storage_ptr__->data = image.data;
      __return_storage_ptr__->width = image.width;
      __return_storage_ptr__->height = image.height;
      image._16_8_ = rVar1._16_8_;
      __return_storage_ptr__->format = image.format;
      __return_storage_ptr__->valid = image.valid;
      *(undefined3 *)&__return_storage_ptr__->field_0x15 = image._21_3_;
      __return_storage_ptr__->data = dst;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_image_color_tint_to_buffer(rf_image image, rf_color color, void* dst, rf_int dst_size)
{
    rf_image result = {0};

    if (image.valid)
    {
        if (dst_size >= rf_image_size(image))
        {
            int bpp = rf_bytes_per_pixel(image.format);

            float c_r = ((float) color.r) / 255.0f;
            float c_g = ((float) color.g) / 255.0f;
            float c_b = ((float) color.b) / 255.0f;
            float c_a = ((float) color.a) / 255.0f;

            for (rf_int y = 0; y < image.height; y++)
            {
                for (rf_int x = 0; x < image.width; x++)
                {
                    int   index = y * image.width + x;
                    void* src_pixel = ((unsigned char*)image.data) + index * bpp;
                    void* dst_pixel = ((unsigned char*)image.data) + index * bpp;

                    rf_color pixel_rgba32 = rf_format_one_pixel_to_rgba32(src_pixel, image.format);

                    pixel_rgba32.r = (unsigned char) (255.f * (((float)pixel_rgba32.r) / 255.f * c_r));
                    pixel_rgba32.g = (unsigned char) (255.f * (((float)pixel_rgba32.g) / 255.f * c_g));
                    pixel_rgba32.b = (unsigned char) (255.f * (((float)pixel_rgba32.b) / 255.f * c_b));
                    pixel_rgba32.a = (unsigned char) (255.f * (((float)pixel_rgba32.a) / 255.f * c_a));

                    rf_format_one_pixel(&pixel_rgba32, RF_UNCOMPRESSED_R8G8B8A8, dst_pixel, image.format);
                }
            }

            result = image;
            result.data = dst;
        }
    }

    return result;
}